

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FACopyDescriptor.H
# Opt level: O2

FillBoxId * __thiscall
amrex::FabArrayCopyDescriptor<amrex::FArrayBox>::AddBox
          (FillBoxId *__return_storage_ptr__,FabArrayCopyDescriptor<amrex::FArrayBox> *this,
          FabArrayId fabarrayid,Box *destFabBox,BoxList *returnedUnfilledBoxes,int fabarrayindex,
          int srccomp,int destcomp,int numcomp,bool bUseValidBox)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  BoxList *rhs;
  BoxDomain unfilledBoxDomain;
  
  BoxDomain::BoxDomain(&unfilledBoxDomain,(IndexType)(destFabBox->btype).itype);
  if (returnedUnfilledBoxes != (BoxList *)0x0) {
    BoxDomain::add(&unfilledBoxDomain,destFabBox);
  }
  AddBoxDoIt(this,fabarrayid,destFabBox,returnedUnfilledBoxes,fabarrayindex,srccomp,destcomp,numcomp
             ,bUseValidBox,&unfilledBoxDomain);
  if (returnedUnfilledBoxes != (BoxList *)0x0) {
    BoxList::clear(returnedUnfilledBoxes);
    rhs = BoxDomain::boxList(&unfilledBoxDomain);
    BoxList::operator=(returnedUnfilledBoxes,rhs);
  }
  iVar1 = this->nextFillBoxId;
  this->nextFillBoxId = iVar1 + 1;
  uVar2 = *(undefined8 *)(destFabBox->smallend).vect;
  uVar3 = *(undefined8 *)((destFabBox->smallend).vect + 2);
  uVar4 = *(undefined8 *)((destFabBox->bigend).vect + 2);
  *(undefined8 *)(__return_storage_ptr__->m_fillBox).bigend.vect =
       *(undefined8 *)(destFabBox->bigend).vect;
  *(undefined8 *)((__return_storage_ptr__->m_fillBox).bigend.vect + 2) = uVar4;
  *(undefined8 *)(__return_storage_ptr__->m_fillBox).smallend.vect = uVar2;
  *(undefined8 *)((__return_storage_ptr__->m_fillBox).smallend.vect + 2) = uVar3;
  __return_storage_ptr__->m_fillBoxId = iVar1;
  __return_storage_ptr__->m_fabIndex = -1;
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
            ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&unfilledBoxDomain);
  return __return_storage_ptr__;
}

Assistant:

FillBoxId
FabArrayCopyDescriptor<FAB>::AddBox (FabArrayId fabarrayid,
                                     const Box& destFabBox,
                                     BoxList*   returnedUnfilledBoxes,
                                     int        fabarrayindex,
                                     int        srccomp,
                                     int        destcomp,
                                     int        numcomp,
                                     bool       bUseValidBox)
{
    BoxDomain unfilledBoxDomain(destFabBox.ixType());

    if (returnedUnfilledBoxes != 0)
    {
        unfilledBoxDomain.add(destFabBox);
    }

    AddBoxDoIt(fabarrayid,
               destFabBox,
               returnedUnfilledBoxes,
               fabarrayindex,
               srccomp,
               destcomp,
               numcomp,
               bUseValidBox,
               unfilledBoxDomain);

    if (returnedUnfilledBoxes != 0)
    {
        returnedUnfilledBoxes->clear();
        (*returnedUnfilledBoxes) = unfilledBoxDomain.boxList();
    }

    return FillBoxId(nextFillBoxId++, destFabBox);
}